

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O1

void __thiscall ki::dml::Field<unsigned_short>::~Field(Field<unsigned_short> *this)

{
  pointer pcVar1;
  
  (this->super_FieldBase).super_Serializable._vptr_Serializable =
       (_func_int **)&PTR___cxa_pure_virtual_0018cc90;
  pcVar1 = (this->super_FieldBase).m_name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_FieldBase).m_name.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~Field() = default;